

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_shr_long_Test::TestBody(correctness_shr_long_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  big_integer *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  char *in_stack_fffffffffffffc50;
  allocator<char> *actual_expression;
  big_integer *in_stack_fffffffffffffc58;
  int iVar2;
  big_integer *a;
  char *in_stack_fffffffffffffc60;
  Type in_stack_fffffffffffffc6c;
  Type type;
  allocator<char> *in_stack_fffffffffffffc70;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc78;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  allocator<char> local_349;
  Message *in_stack_fffffffffffffcb8;
  AssertHelper *in_stack_fffffffffffffcc0;
  undefined1 local_2b1 [89];
  AssertionResult local_258 [2];
  allocator<char> local_231;
  string local_230 [151];
  allocator<char> local_199;
  string local_198 [88];
  AssertionResult local_140 [2];
  allocator<char> local_119;
  string local_118 [96];
  string *in_stack_ffffffffffffff48;
  big_integer *in_stack_ffffffffffffff50;
  allocator<char> local_71;
  string local_70 [88];
  AssertionResult local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  big_integer::big_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  big_integer::big_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator>>(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            (&in_stack_fffffffffffffc58->sign,in_stack_fffffffffffffc50,
             (big_integer *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc70);
    in_stack_fffffffffffffc80 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x122ccd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
               in_stack_fffffffffffffc50);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
    testing::Message::~Message((Message *)0x122d2a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122d82);
  __s = &local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc80,(char *)__s,in_stack_fffffffffffffc70);
  big_integer::big_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __a = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffc80,(char *)__s,__a);
  big_integer::big_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator>>(in_stack_fffffffffffffc58,(int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            (&in_stack_fffffffffffffc58->sign,in_stack_fffffffffffffc50,
             (big_integer *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40);
  iVar2 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc6c);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    in_stack_fffffffffffffc60 =
         testing::AssertionResult::failure_message((AssertionResult *)0x123002);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,in_stack_fffffffffffffc60,iVar2,in_stack_fffffffffffffc50);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
    testing::Message::~Message((Message *)0x12305f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1230b7);
  a = (big_integer *)local_2b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffc80,(char *)__s,__a);
  big_integer::big_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  actual_expression = &local_349;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffc80,(char *)__s,__a);
  big_integer::big_integer(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  operator>>(a,(int)((ulong)actual_expression >> 0x20));
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            (&a->sign,(char *)actual_expression,
             (big_integer *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
             in_stack_fffffffffffffc40);
  iVar2 = (int)((ulong)a >> 0x20);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
  std::allocator<char>::~allocator(&local_349);
  big_integer::~big_integer(in_stack_fffffffffffffc40);
  std::__cxx11::string::~string((string *)(local_2b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12332b)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,in_stack_fffffffffffffc60,iVar2,(char *)actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x123379);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1233c8);
  return;
}

Assistant:

TEST(correctness, shr_long)
{
    EXPECT_EQ(big_integer("4730073393008085198307104580698364137020387111323398632330851"),
              big_integer("151362348576258726345827346582347652384652387562348756234587245") >> 5);

    EXPECT_EQ(big_integer("1118311528397465815295799577134738919815767762822175104787"),
              big_integer("143143875634875624357862345873246581736418273641238413412741") >> 7);

    EXPECT_EQ(big_integer("-1591563309890326054125627839548891585559049824963"),
              big_integer("-3417856182746231874623148723164812376512852437523846123876") >> 31);

}